

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

void __thiscall
Database::ExecuteQueries<std::_List_iterator<std::__cxx11::string>>
          (Database *this,
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end)

{
  bool bVar1;
  Database_Exception *this_00;
  _Bind<void_(Database::Bulk_Query_Context::*(Database::Bulk_Query_Context_*,_std::_Placeholder<1>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_98;
  Bulk_Query_Context *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined1 local_30 [8];
  Bulk_Query_Context qc;
  Database *this_local;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  qc._8_8_ = this;
  Bulk_Query_Context::Bulk_Query_Context((Bulk_Query_Context *)local_30,this);
  bVar1 = Bulk_Query_Context::Pending((Bulk_Query_Context *)local_30);
  if (!bVar1) {
    this_00 = (Database_Exception *)__cxa_allocate_exception(0x10);
    Database_Exception::Database_Exception
              (this_00,"Cannot execute bulk query with transaction in progress");
    __cxa_throw(this_00,&Database_Exception::typeinfo,Database_Exception::~Database_Exception);
  }
  local_78 = Bulk_Query_Context::RawQuery;
  local_70 = 0;
  local_80 = (Bulk_Query_Context *)local_30;
  local_50._M_node = end._M_node;
  local_48._M_node = begin._M_node;
  std::
  bind<void(Database::Bulk_Query_Context::*)(std::__cxx11::string_const&),Database::Bulk_Query_Context*,std::_Placeholder<1>const&>
            (&local_68,(offset_in_Bulk_Query_Context_to_subr *)&local_78,&local_80,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::
  for_each<std::_List_iterator<std::__cxx11::string>,std::_Bind<void(Database::Bulk_Query_Context::*(Database::Bulk_Query_Context*,std::_Placeholder<1>))(std::__cxx11::string_const&)>>
            (&local_98,local_48,local_50,&local_68);
  Bulk_Query_Context::Commit((Bulk_Query_Context *)local_30);
  Bulk_Query_Context::~Bulk_Query_Context((Bulk_Query_Context *)local_30);
  return;
}

Assistant:

void ExecuteQueries(IT begin, IT end)
		{
			using namespace std::placeholders;

			Bulk_Query_Context qc(*this);

			if (!qc.Pending())
				throw Database_Exception("Cannot execute bulk query with transaction in progress");

			std::for_each(begin, end, std::bind(&Bulk_Query_Context::RawQuery, &qc, _1));

			qc.Commit();
		}